

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_table_data.cpp
# Opt level: O0

void __thiscall duckdb::PersistentTableData::~PersistentTableData(PersistentTableData *this)

{
  TableStatistics::~TableStatistics(&this->table_stats);
  return;
}

Assistant:

PersistentTableData::~PersistentTableData() {
}